

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O1

int main(int argc,char **argv)

{
  unfinished_tasks_test_params_class *this;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<int> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  TestArgsWrapper unfinished_tasks_test_params;
  TestSuite test;
  allocator_type local_309;
  string local_308;
  TestArgsWrapper local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  TestSuite local_1e8;
  TestRange<int> local_190;
  TestRange<unsigned_long> local_160;
  TestRange<unsigned_long> local_128;
  TestRange<unsigned_long> local_f0;
  TestRange<unsigned_long> local_b8;
  TestRange<unsigned_long> local_80;
  TestRange<unsigned_long> local_48;
  
  TestSuite::TestSuite(&local_1e8,argc,argv);
  local_1e8.options.printTestMessage = true;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"basic test","");
  local_2e8.test_args = (TestArgsBase *)0x0;
  uStack_2e0 = 1;
  local_2d8 = 4;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_2e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l,&local_309);
  local_48.type = ARRAY;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48.array,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  local_48.begin = 0;
  local_48.end = 0;
  local_48.step = 0;
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>(&local_1e8,&local_208,basic_test,&local_48)
  ;
  if (local_48.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"recurring test","");
  local_2e8.test_args = (TestArgsBase *)0x0;
  uStack_2e0 = 1;
  local_2d8 = 2;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_2e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_00,&local_309);
  local_80.type = ARRAY;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_80.array,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  local_80.begin = 0;
  local_80.end = 0;
  local_80.step = 0;
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&local_1e8,&local_228,recurring_test,&local_80);
  if (local_80.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"relay test","");
  local_2e8.test_args = (TestArgsBase *)0x0;
  uStack_2e0 = 1;
  local_2d8 = 2;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)&local_2e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_01,&local_309);
  local_b8.type = ARRAY;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b8.array,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  local_b8.begin = 0;
  local_b8.end = 0;
  local_b8.step = 0;
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>(&local_1e8,&local_248,relay_test,&local_b8)
  ;
  if (local_b8.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"fast relay test","");
  local_2e8.test_args = (TestArgsBase *)0x100000000;
  uStack_2e0 = CONCAT44(uStack_2e0._4_4_,2);
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_2e8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_308,__l_02,(allocator_type *)&local_309);
  local_190.type = ARRAY;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_190.array,(vector<int,_std::allocator<int>_> *)&local_308);
  local_190.begin = 0;
  local_190.end = 0;
  local_190.step = 0;
  TestSuite::doTest<int,int(*)(int)>(&local_1e8,&local_268,fast_relay_test,&local_190);
  if (local_190.array.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_190.array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_308._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"reschedule one time test","");
  local_2e8.test_args = (TestArgsBase *)0x0;
  uStack_2e0 = 1;
  local_2d8 = 2;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_2e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_03,&local_309);
  local_f0.type = ARRAY;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_f0.array,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  local_f0.begin = 0;
  local_f0.end = 0;
  local_f0.step = 0;
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&local_1e8,&local_288,reschedule_one_time_test,&local_f0);
  if (local_f0.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,"reschedule recurring test","");
  local_2e8.test_args = (TestArgsBase *)0x0;
  uStack_2e0 = 1;
  local_2d8 = 2;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_2e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_04,&local_309);
  local_128.type = ARRAY;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_128.array,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  local_128.begin = 0;
  local_128.end = 0;
  local_128.step = 0;
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&local_1e8,&local_2a8,reschedule_recurring_test,&local_128);
  if (local_128.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.array.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_308._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"mixed test","");
  local_2e8.test_args = (TestArgsBase *)0x0;
  uStack_2e0 = 1;
  local_2d8 = 4;
  __l_05._M_len = 3;
  __l_05._M_array = (iterator)&local_2e8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308,__l_05,&local_309);
  local_160.type = ARRAY;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_160.array,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_308);
  local_160.begin = 0;
  local_160.end = 0;
  local_160.step = 0;
  TestSuite::doTest<unsigned_long,int(*)(unsigned_long)>
            (&local_1e8,&local_2c8,mixed_test,&local_160);
  if (local_160.array.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.array.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_308._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  this = (unfinished_tasks_test_params_class *)operator_new(0xe0);
  unfinished_tasks_test_params_class::unfinished_tasks_test_params_class(this);
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_2e8.test_args = (TestArgsBase *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"unfinished tasks test","");
  TestSuite::doTest<int(*)(TestArgsBase*)>(&local_1e8,&local_308,unfinished_tasks_test,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if ((unfinished_tasks_test_params_class *)local_2e8.test_args !=
      (unfinished_tasks_test_params_class *)0x0) {
    (*((TestArgsBase *)&(local_2e8.test_args)->_vptr_TestArgsBase)->_vptr_TestArgsBase[1])();
  }
  TestSuite::~TestSuite(&local_1e8);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite test(argc, argv);
    test.options.printTestMessage = true;

    test.doTest( "basic test",
                 basic_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    test.doTest( "recurring test",
                 recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "relay test",
                 relay_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "fast relay test",
                 fast_relay_test,
                 TestRange<int>( {0, 1, 2} ) );

    test.doTest( "reschedule one time test",
                 reschedule_one_time_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "reschedule recurring test",
                 reschedule_recurring_test,
                 TestRange<size_t>( {0, 1, 2} ) );

    test.doTest( "mixed test",
                 mixed_test,
                 TestRange<size_t>( {0, 1, 4} ) );

    SET_PARAMS(unfinished_tasks_test_params);
    test.doTest( "unfinished tasks test",
                 unfinished_tasks_test,
                 unfinished_tasks_test_params );

    return 0;
}